

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

bool __thiscall
DirectorBase::ShouldCut
          (DirectorBase *this,ChessTickType currentTime,int nScore,uint nDepthSearched,
          Position *rootPosition,Moves *mPrincipalVariation)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = true;
  if (nDepthSearched < 100) {
    if (this->m_nDepth == 0) {
      uVar3 = (ulong)this->m_nMoveTime;
      if (uVar3 == 0) {
        if (this->m_bInfinite != false) {
          return false;
        }
        if (this->m_SearchStopTime == 0) {
          (*this->_vptr_DirectorBase[5])(this,currentTime);
        }
        uVar3 = this->m_SearchStopTime;
        lVar1 = uVar3 - currentTime;
      }
      else {
        lVar1 = uVar3 - currentTime;
      }
      bVar2 = uVar3 == currentTime || SBORROW8(uVar3,currentTime) != lVar1 < 0;
    }
    else {
      bVar2 = this->m_nDepth <= nDepthSearched;
    }
  }
  return bVar2;
}

Assistant:

virtual bool ShouldCut(
        const Clock::ChessTickType currentTime,
        const int nScore,
        const unsigned int nDepthSearched,
        const Position &rootPosition,
        const Moves &mPrincipalVariation
    )
    {
        /* This can happen in late end game. */
        if ( nDepthSearched >= 100 )
            return true;

        if ( m_nDepth != 0 )
            return ( nDepthSearched >= m_nDepth );

        if ( m_nMoveTime != 0 )
            return ( currentTime >= m_nMoveTime );

        if ( m_bInfinite )
            return false;

        if ( m_SearchStopTime == 0 )
            CalculateSearchStopTime( currentTime, nScore, nDepthSearched,
                                     rootPosition, mPrincipalVariation );

        return ( currentTime >= m_SearchStopTime );
    }